

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_wiener_convolve_add_src_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint16_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int16_t *b;
  int16_t *extraout_RDX;
  uint uVar11;
  ulong uVar12;
  int sum;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint16_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puStack_10770;
  int iStack_10768;
  uint16_t temp [33664];
  
  uVar6 = (uint)((ulong)filter_y >> 4) & 0xf;
  iVar10 = ((int)((h + -1) * y_step_q4 + uVar6) >> 4) + 7;
  lVar3 = (long)(iVar10 * 0x80);
  puVar17 = temp + lVar3 + 0x38;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x3c;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x30;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x34;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x28;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x2c;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x20;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x24;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x18;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x1c;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x10;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0x14;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 8;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 0xc;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar17 = temp + lVar3 + 4;
  puVar17[0] = 0;
  puVar17[1] = 0;
  puVar17[2] = 0;
  puVar17[3] = 0;
  puVar18 = src + src_stride * -3 + -3;
  bVar4 = (byte)conv_params->round_0;
  uVar15 = ~(-1 << (0x10 - bVar4 & 0x1f));
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = 0;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  puVar17 = temp;
  for (iVar7 = 0; iVar7 != iVar10; iVar7 = iVar7 + 1) {
    uVar14 = (uint)((ulong)filter_x >> 4) & 0xf;
    for (uVar16 = 0; uVar16 != uVar8; uVar16 = uVar16 + 1) {
      iVar13 = 0;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        iVar13 = iVar13 + (int)*(short *)((ulong)((uVar14 & 0xf) << 4) +
                                          ((ulong)filter_x & 0xffffffffffffff00) + lVar3 * 2) *
                          (uint)puVar18[lVar3 + ((int)uVar14 >> 4)];
      }
      uVar11 = (int)((uint)puVar18[(long)((int)uVar14 >> 4) + 3] * 0x80 +
                     ((1 << (bVar4 & 0x1f)) >> 1) + 0x4000 + iVar13) >> (bVar4 & 0x1f);
      uVar2 = uVar15;
      if ((int)uVar11 < (int)uVar15) {
        uVar2 = uVar11;
      }
      uVar5 = (uint16_t)uVar2;
      if ((int)uVar11 < 0) {
        uVar5 = 0;
      }
      puVar17[uVar16] = uVar5;
      uVar14 = uVar14 + x_step_q4;
    }
    puVar18 = puVar18 + src_stride;
    puVar17 = puVar17 + 0x80;
  }
  bVar4 = (byte)conv_params->round_1;
  uVar15 = -1 << (bVar4 + 7 & 0x1f);
  b = (int16_t *)(ulong)uVar15;
  uVar9 = 0;
  uVar16 = (ulong)(uint)h;
  if (h < 1) {
    uVar16 = uVar9;
  }
  puVar17 = temp;
  puStack_10770 = dst;
  while( true ) {
    iStack_10768 = (int)uVar8;
    uVar12 = uVar16;
    puVar18 = puStack_10770;
    uVar14 = uVar6;
    if ((int)uVar9 == iStack_10768) break;
    while (uVar12 != 0) {
      uVar1 = puVar17[(long)((int)uVar14 >> 4) * 0x80 + 0x180];
      iVar10 = highbd_vert_scalar_product
                         (puVar17 + (long)((int)uVar14 >> 4) * 0x80,
                          (ulong)((uVar14 & 0xf) << 4) + ((ulong)filter_y & 0xffffffffffffff00),b);
      iVar10 = iVar10 + ((1 << (bVar4 & 0x1f)) >> 1) + uVar15 + (uint)uVar1 * 0x80;
      if (iVar10 >> (bVar4 & 0x1f) < 1) {
        iVar10 = 0;
      }
      iVar10 = iVar10 >> (bVar4 & 0x1f);
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
      *puVar18 = (uint8_t)iVar10;
      b = extraout_RDX;
      uVar12 = uVar12 - 1;
      puVar18 = puVar18 + dst_stride;
      uVar14 = uVar14 + y_step_q4;
    }
    puVar17 = puVar17 + 1;
    puStack_10770 = puStack_10770 + 1;
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_c(const uint8_t *src, ptrdiff_t src_stride,
                                   uint8_t *dst, ptrdiff_t dst_stride,
                                   const int16_t *filter_x, int x_step_q4,
                                   const int16_t *filter_y, int y_step_q4,
                                   int w, int h,
                                   const WienerConvolveParams *conv_params) {
  const InterpKernel *const filters_x = get_filter_base(filter_x);
  const int x0_q4 = get_filter_offset(filter_x, filters_x);

  const InterpKernel *const filters_y = get_filter_base(filter_y);
  const int y0_q4 = get_filter_offset(filter_y, filters_y);

  uint16_t temp[WIENER_MAX_EXT_SIZE * MAX_SB_SIZE];
  const int intermediate_height =
      (((h - 1) * y_step_q4 + y0_q4) >> SUBPEL_BITS) + SUBPEL_TAPS - 1;
  memset(temp + (intermediate_height * MAX_SB_SIZE), 0, MAX_SB_SIZE);

  assert(w <= MAX_SB_SIZE);
  assert(h <= MAX_SB_SIZE);
  assert(y_step_q4 <= 32);
  assert(x_step_q4 <= 32);

  convolve_add_src_horiz_hip(src - src_stride * (SUBPEL_TAPS / 2 - 1),
                             src_stride, temp, MAX_SB_SIZE, filters_x, x0_q4,
                             x_step_q4, w, intermediate_height,
                             conv_params->round_0);
  convolve_add_src_vert_hip(temp + MAX_SB_SIZE * (SUBPEL_TAPS / 2 - 1),
                            MAX_SB_SIZE, dst, dst_stride, filters_y, y0_q4,
                            y_step_q4, w, h, conv_params->round_1);
}